

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void getSymbol(void)

{
  int iVar1;
  int isKeyWord;
  int ret;
  
  currentSymbol = 0;
  while (terminate == 0 && currentCharacter < '!') {
    getCharacter();
  }
  if (terminate == 1) {
    currentSymbol = -2;
  }
  else if (currentCharacter == '&') {
    getCharacter();
    if (currentCharacter == '&') {
      currentSymbol = 0xca;
      getCharacter();
    }
    else {
      mark("error in logic and");
      currentSymbol = 900;
      getCharacter();
    }
  }
  else if (currentCharacter == '|') {
    getCharacter();
    if (currentCharacter == '|') {
      currentSymbol = 0xc9;
      getCharacter();
    }
    else {
      mark("error in logic or");
      currentSymbol = 900;
      getCharacter();
    }
  }
  else if (currentCharacter == '*') {
    currentSymbol = 99;
    getCharacter();
  }
  else if (currentCharacter == '#') {
    getCharacter();
    iVar1 = handleIdentifier();
    if (iVar1 != 0x270) {
      mark("bad include");
      exit(-1);
    }
    currentSymbol = 0x271;
  }
  else if (currentCharacter == '.') {
    getCharacter();
    currentSymbol = 0x272;
  }
  else if (currentCharacter == '/') {
    currentSymbol = 100;
    getCharacter();
    if (currentCharacter == '*') {
      getCharacter();
      while (currentCharacter != '*') {
        getCharacter();
      }
      getCharacter();
      if (currentCharacter != '/') {
        mark("bad termination of comment");
        exit(-1);
      }
      getCharacter();
      getSymbol();
    }
  }
  else if (currentCharacter == '%') {
    currentSymbol = 0x6c;
    getCharacter();
  }
  else if (currentCharacter == '(') {
    currentSymbol = 0x12d;
    getCharacter();
  }
  else if (currentCharacter == ')') {
    currentSymbol = 0x12e;
    getCharacter();
  }
  else if (currentCharacter == ']') {
    currentSymbol = 0x12f;
    getCharacter();
  }
  else if (currentCharacter == '[') {
    currentSymbol = 0x130;
    getCharacter();
  }
  else if (currentCharacter == '+') {
    currentSymbol = 0x61;
    getCharacter();
  }
  else if (currentCharacter == '-') {
    currentSymbol = 0x62;
    getCharacter();
    if (currentCharacter == '>') {
      currentSymbol = 0xcd;
      getCharacter();
    }
  }
  else if (currentCharacter == '{') {
    currentSymbol = 0x131;
    getCharacter();
  }
  else if (currentCharacter == '}') {
    currentSymbol = 0x132;
    getCharacter();
  }
  else if (currentCharacter == '=') {
    currentSymbol = 0x65;
    getCharacter();
    if (currentCharacter == '=') {
      currentSymbol = 0x66;
      getCharacter();
    }
  }
  else if (currentCharacter == '<') {
    currentSymbol = 0x6a;
    getCharacter();
    if (currentCharacter == '=') {
      currentSymbol = 0x67;
      getCharacter();
    }
  }
  else if (currentCharacter == '>') {
    currentSymbol = 0x6b;
    getCharacter();
    if (currentCharacter == '=') {
      currentSymbol = 0x68;
      getCharacter();
    }
  }
  else if (currentCharacter == '!') {
    getCharacter();
    if (currentCharacter == '=') {
      currentSymbol = 0x69;
      getCharacter();
    }
    else {
      currentSymbol = 900;
      getCharacter();
    }
  }
  else if ((currentCharacter < '0') || ('9' < currentCharacter)) {
    if (((currentCharacter < 'A') || ('Z' < currentCharacter)) &&
       (((currentCharacter < 'a' || ('z' < currentCharacter)) && (currentCharacter != '_')))) {
      if (currentCharacter == '\"') {
        handleStringLiteral();
        currentSymbol = 0x1f7;
      }
      else if (currentCharacter == ';') {
        currentSymbol = 0xcb;
        getCharacter();
      }
      else if (currentCharacter == ',') {
        currentSymbol = 0xcc;
        getCharacter();
      }
      else if (currentCharacter == '\'') {
        iVar1 = handleCharacterLiteral();
        if (iVar1 == -1) {
          exit(-1);
        }
        currentSymbol = 0x1f8;
      }
      else {
        currentSymbol = 900;
        getCharacter();
      }
    }
    else {
      currentSymbol = handleIdentifier();
      if (currentSymbol < 1) {
        currentSymbol = 0x1f5;
      }
    }
  }
  else {
    iVar1 = handleNumber();
    if (iVar1 < 0) {
      exit(-1);
    }
    currentSymbol = 0x1f6;
  }
  return;
}

Assistant:

procedure 
void getSymbol (void) {
	variable int ret;
	variable int isKeyWord;
	ret = 0;
	isKeyWord = 0;
	currentSymbol=0;
	while ((terminate == false) && (currentCharacter <= ' ')) {
		getCharacter();
	} 

	if (terminate == true )  {
		currentSymbol = SYMBOL_END;
	} elsif (currentCharacter == '&') {	
		getCharacter();
		if (currentCharacter == '&') {
			currentSymbol = SYMBOL_AND;
			getCharacter();
		} else {
			mark("error in logic and");
			currentSymbol = SYMBOL_UNKNOWN;
			getCharacter();
		}
	} elsif (currentCharacter == '|') {	
		getCharacter();
		if (currentCharacter == '|') {
			currentSymbol = SYMBOL_OR;
			getCharacter();
		} else {
			mark("error in logic or");
			currentSymbol = SYMBOL_UNKNOWN;
			getCharacter();
		}
	} elsif (currentCharacter == '*') {
		currentSymbol = SYMBOL_MUL;
		getCharacter();
	} elsif (currentCharacter == '#') {
		getCharacter();
		isKeyWord = handleIdentifier();
		if (isKeyWord == SYMBOL_INCLUDE) {
			currentSymbol = SYMBOL_HASHINCLUDE;
		} else {
			mark("bad include");
			exit(-1);	}
	} elsif (currentCharacter == '.') {
		getCharacter();
		currentSymbol = SYMBOL_DOT;
	} elsif (currentCharacter == '/') {
		currentSymbol = SYMBOL_DIV;
		getCharacter();
		if (currentCharacter == '*') {
			getCharacter();
			while (currentCharacter != '*') {
				getCharacter();
			}
			getCharacter();
			if (currentCharacter == '/') {
				getCharacter();
			} else {
				mark("bad termination of comment");
				exit(-1);
			}
			getSymbol();
		}
	} elsif (currentCharacter == '%') {
		currentSymbol = SYMBOL_MOD;
		getCharacter();
	} elsif (currentCharacter == '(') {	
		currentSymbol = SYMBOL_LPARAN;
		getCharacter();
	} elsif (currentCharacter == ')') {	
		currentSymbol = SYMBOL_RPARAN;
		getCharacter();
	} elsif (currentCharacter == ']') {
		currentSymbol = SYMBOL_RBRAK;
		getCharacter();
	} 	elsif (currentCharacter == '[') {
		currentSymbol = SYMBOL_LBRAK;
		getCharacter();
	} elsif (currentCharacter == '+') {
		currentSymbol = SYMBOL_ADD;
		getCharacter();
	} elsif (currentCharacter == '-') {
		currentSymbol = SYMBOL_SUB;
		getCharacter();
		if (currentCharacter == '>') {
			currentSymbol = SYMBOL_ARROW;
			getCharacter();
		}
	} elsif (currentCharacter == '{') {
		currentSymbol = SYMBOL_CLBRAK;
		getCharacter();
	} elsif (currentCharacter == '}') {
		currentSymbol = SYMBOL_CRBRAK;
		getCharacter();
	} elsif (currentCharacter == '=') {
		currentSymbol = SYMBOL_ASSIGN;
		getCharacter();
		if (currentCharacter == '=') {
			currentSymbol = SYMBOL_EQUALTEST;
			getCharacter();
		}
	} elsif (currentCharacter == '<') {
		currentSymbol = SYMBOL_LESS;
		getCharacter();
		if (currentCharacter == '='){
			currentSymbol = SYMBOL_LEQ;
			getCharacter();
		}
	} elsif (currentCharacter == '>') {
		currentSymbol = SYMBOL_GREATER;
		getCharacter();
		if (currentCharacter == '=') {
			currentSymbol = SYMBOL_GEQ;
			getCharacter();
		}
	} elsif (currentCharacter == '!') {
		getCharacter();
		if (currentCharacter == '=') {
			currentSymbol = SYMBOL_NOT;
			getCharacter();
		} else {
			currentSymbol = SYMBOL_UNKNOWN;
			getCharacter();
		}
	} elsif ((currentCharacter >= '0') &&  (currentCharacter <= '9')) {
		ret = handleNumber();
		if (ret < 0) {
			exit(-1);
		}
		currentSymbol = SYMBOL_NUMBER;
	} 
	elsif (((currentCharacter >= 'A') && (currentCharacter <= 'Z')) || 
		   ((currentCharacter >= 'a') && (currentCharacter <= 'z')) || (currentCharacter == '_')) {
		isKeyWord = handleIdentifier();
		if (isKeyWord > 0) {
			currentSymbol = isKeyWord;
		} else  {
			currentSymbol = SYMBOL_IDENTIFIER;
		}
	} elsif (currentCharacter == '"') {
		handleStringLiteral();
		currentSymbol=SYMBOL_STRINGLITERAL;
	} elsif (currentCharacter == ';') {
		currentSymbol = SYMBOL_SEMICOLON;
		getCharacter();
	} elsif (currentCharacter == ',') {
		currentSymbol = SYMBOL_COMMA;
		getCharacter();
	} elsif (currentCharacter == '\'') { 
		ret = handleCharacterLiteral();
		if (ret == -1) {
			exit(-1);
		}
		currentSymbol = SYMBOL_CHARACTERLITERAL;
	} else {
		currentSymbol = SYMBOL_UNKNOWN;
		getCharacter();
	}
}